

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiSmokeTests.cpp
# Opt level: O0

void vkt::api::anon_unknown_1::createTriangleProgs(SourceCollections *dst)

{
  SourceCollections *this;
  ProgramSources *pPVar1;
  allocator<char> local_109;
  string local_108;
  ShaderSource local_e8;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  ShaderSource local_70;
  allocator<char> local_31;
  string local_30;
  SourceCollections *local_10;
  SourceCollections *dst_local;
  
  local_10 = dst;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"vert",&local_31);
  pPVar1 = ::vk::ProgramCollection<glu::ProgramSources>::add(&dst->glslSources,&local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,
             "#version 310 es\nlayout(location = 0) in highp vec4 a_position;\nvoid main (void) { gl_Position = a_position; }\n"
             ,&local_91);
  glu::VertexSource::VertexSource((VertexSource *)&local_70,&local_90);
  glu::ProgramSources::operator<<(pPVar1,&local_70);
  glu::VertexSource::~VertexSource((VertexSource *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  this = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"frag",&local_b9);
  pPVar1 = ::vk::ProgramCollection<glu::ProgramSources>::add(&this->glslSources,&local_b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,
             "#version 310 es\nlayout(location = 0) out lowp vec4 o_color;\nvoid main (void) { o_color = vec4(1.0, 0.0, 1.0, 1.0); }\n"
             ,&local_109);
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_e8,&local_108);
  glu::ProgramSources::operator<<(pPVar1,&local_e8);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  return;
}

Assistant:

void createTriangleProgs (SourceCollections& dst)
{
	dst.glslSources.add("vert") << glu::VertexSource(
		"#version 310 es\n"
		"layout(location = 0) in highp vec4 a_position;\n"
		"void main (void) { gl_Position = a_position; }\n");
	dst.glslSources.add("frag") << glu::FragmentSource(
		"#version 310 es\n"
		"layout(location = 0) out lowp vec4 o_color;\n"
		"void main (void) { o_color = vec4(1.0, 0.0, 1.0, 1.0); }\n");
}